

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

void slang::ast::SubroutineSymbol::inheritDefaultedArgList
               (Scope *scope,Scope *parentScope,SyntaxNode *syntax,
               SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *arguments)

{
  FormalArgumentSymbol *this;
  string_view arg_00;
  bool bVar1;
  bool bVar2;
  Compilation *__fn;
  Symbol *pSVar3;
  Type *pTVar4;
  SubroutineSymbol *pSVar5;
  reference ppFVar6;
  Expression *pEVar7;
  ulong in_RCX;
  SyntaxNode *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__child_stack;
  Scope *in_RSI;
  ClassType *in_RDI;
  char *in_R8;
  FormalArgumentSymbol *cloned;
  LocalVarCheckVisitor visitor;
  Expression *defVal;
  FormalArgumentSymbol *arg;
  iterator __end6;
  iterator __begin6;
  ArgList *__range6;
  bool anyErrors;
  SubroutineSymbol *constructor;
  ClassType *baseCt;
  Type *baseClass;
  ClassType *ct;
  Compilation *comp;
  SubroutineSymbol *in_stack_fffffffffffffef8;
  ClassType *in_stack_ffffffffffffff00;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
  *in_stack_ffffffffffffff08;
  Diagnostic *in_stack_ffffffffffffff40;
  bool in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff49;
  SyntaxNode *in_stack_ffffffffffffff50;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_98 [2];
  
  __fn = Scope::getCompilation((Scope *)in_RDI);
  pSVar3 = Scope::asSymbol(in_RSI);
  if (pSVar3->kind == ClassType) {
    Scope::asSymbol(in_RSI);
    Symbol::as<slang::ast::ClassType>((Symbol *)0x5221e7);
    pTVar4 = ClassType::getBaseClass(in_stack_ffffffffffffff00);
    if (pTVar4 == (Type *)0x0) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff50);
      Scope::addDiag((Scope *)visitor.syntax,(DiagCode)visitor._36_4_,(SourceRange)visitor.argName);
      arg_00._M_len._1_7_ = in_stack_ffffffffffffff49;
      arg_00._M_len._0_1_ = in_stack_ffffffffffffff48;
      arg_00._M_str = (char *)in_stack_ffffffffffffff50;
      Diagnostic::operator<<(in_stack_ffffffffffffff40,arg_00);
    }
    else {
      bVar1 = Type::isClass((Type *)0x5222b5);
      if (bVar1) {
        Type::getCanonicalType(&in_stack_ffffffffffffff00->super_Type);
        Symbol::as<slang::ast::ClassType>((Symbol *)0x5222d3);
        pSVar5 = ClassType::getConstructor(in_RDI);
        if (pSVar5 != (SubroutineSymbol *)0x0) {
          bVar1 = false;
          join_0x00000010_0x00000000_ = getArguments(in_stack_fffffffffffffef8);
          local_98[0]._M_current =
               (FormalArgumentSymbol **)
               std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
               begin((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                     in_stack_fffffffffffffef8);
          std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                    (in_stack_ffffffffffffff08);
          while (bVar2 = __gnu_cxx::
                         operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                   ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                     *)in_stack_ffffffffffffff00,
                                    (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                     *)in_stack_fffffffffffffef8), ((bVar2 ^ 0xffU) & 1) != 0) {
            ppFVar6 = __gnu_cxx::
                      __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                      ::operator*(local_98);
            this = *ppFVar6;
            pEVar7 = FormalArgumentSymbol::getDefaultValue
                               ((FormalArgumentSymbol *)local_98[2]._M_current);
            __child_stack = extraout_RDX;
            if (((!bVar1) && (pEVar7 != (Expression *)0x0)) &&
               (bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                  (&(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name
                                  ), __child_stack = extraout_RDX_00, !bVar2)) {
              in_R8 = (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str;
              LocalVarCheckVisitor::LocalVarCheckVisitor
                        ((LocalVarCheckVisitor *)&stack0xffffffffffffff28,(Scope *)in_RDI,in_RDX,
                         (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
              Expression::visit<slang::ast::LocalVarCheckVisitor&>
                        ((Expression *)in_stack_ffffffffffffff00,
                         (LocalVarCheckVisitor *)in_stack_fffffffffffffef8);
              in_RCX = (ulong)(in_stack_ffffffffffffff48 & 1U);
              bVar1 = (in_stack_ffffffffffffff48 & 1U) != 0;
              __child_stack = extraout_RDX_01;
            }
            FormalArgumentSymbol::clone(this,(__fn *)__fn,__child_stack,(int)in_RCX,in_R8);
            Scope::addMember((Scope *)in_stack_ffffffffffffff00,
                             &in_stack_fffffffffffffef8->super_Symbol);
            SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::push_back
                      ((SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)
                       in_stack_ffffffffffffff00,(FormalArgumentSymbol **)in_stack_fffffffffffffef8)
            ;
            __gnu_cxx::
            __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
            ::operator++(local_98);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SubroutineSymbol::inheritDefaultedArgList(
    Scope& scope, const Scope& parentScope, const SyntaxNode& syntax,
    SmallVectorBase<const FormalArgumentSymbol*>& arguments) {

    auto& comp = scope.getCompilation();
    if (parentScope.asSymbol().kind == SymbolKind::ClassType) {
        auto& ct = parentScope.asSymbol().as<ClassType>();
        auto baseClass = ct.getBaseClass();
        if (!baseClass) {
            scope.addDiag(diag::SuperNoBase, syntax.sourceRange()) << ct.name;
        }
        else if (baseClass->isClass()) {
            // Note: we check isClass() above to skip over cases where
            // the baseClass is the ErrorType.
            auto& baseCt = baseClass->getCanonicalType().as<ClassType>();
            if (auto constructor = baseCt.getConstructor()) {
                // We found the base class's constructor.
                // Pull in all arguments from it.
                bool anyErrors = false;
                for (auto arg : constructor->getArguments()) {
                    // It's an error if any of the inherited arguments
                    // have default values that refer to local members
                    // of the parent class.
                    if (auto defVal = arg->getDefaultValue();
                        !anyErrors && defVal && !arg->name.empty()) {
                        LocalVarCheckVisitor visitor(scope, syntax, arg->name);
                        defVal->visit(visitor);
                        anyErrors |= visitor.anyErrors;
                    }

                    auto& cloned = arg->clone(comp);
                    scope.addMember(cloned);
                    arguments.push_back(&cloned);
                }
            }
        }
    }
}